

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O0

void __thiscall mocker::ast::ASTRoot::~ASTRoot(ASTRoot *this)

{
  ASTRoot *this_local;
  
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__ASTRoot_0039e810;
  std::
  vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
  ::~vector(&this->decls);
  ASTNode::~ASTNode(&this->super_ASTNode);
  return;
}

Assistant:

explicit ASTRoot(std::vector<std::shared_ptr<Declaration>> decls)
      : decls(std::move(decls)) {}